

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

void __thiscall
phyr::Film::mergeFilmTile
          (Film *this,unique_ptr<phyr::FilmTile,_std::default_delete<phyr::FilmTile>_> *tile)

{
  FilmTile *pFVar1;
  double dVar2;
  FilmTilePixel *this_00;
  Pixel *pPVar3;
  Bounds2iIterator BVar4;
  Bounds2iIterator __begin1;
  Point2i pixel;
  double xyz [3];
  Bounds2iIterator local_98;
  pthread_mutex_t *local_88;
  Bounds2i *local_80;
  Film *local_78;
  Point2i local_70;
  double local_68;
  double dStack_60;
  double local_58;
  Bounds2i local_48;
  
  local_88 = (pthread_mutex_t *)&this->mutex;
  local_78 = this;
  std::mutex::lock((mutex *)&local_88->__data);
  pFVar1 = (tile->_M_t).super___uniq_ptr_impl<phyr::FilmTile,_std::default_delete<phyr::FilmTile>_>.
           _M_t.super__Tuple_impl<0UL,_phyr::FilmTile_*,_std::default_delete<phyr::FilmTile>_>.
           super__Head_base<0UL,_phyr::FilmTile_*,_false>._M_head_impl;
  local_98.pt = (pFVar1->pixelBounds).pMin;
  local_48.pMax = (pFVar1->pixelBounds).pMax;
  local_98.bounds = &local_48;
  local_48.pMin = local_98.pt;
  BVar4 = end(local_98.bounds);
  local_80 = BVar4.bounds;
  while (((local_98.pt.x != BVar4.pt.x || (local_98.pt.y != BVar4.pt.y)) ||
         (local_98.bounds != local_80))) {
    local_70 = local_98.pt;
    this_00 = FilmTile::getPixel((tile->_M_t).
                                 super___uniq_ptr_impl<phyr::FilmTile,_std::default_delete<phyr::FilmTile>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_phyr::FilmTile_*,_std::default_delete<phyr::FilmTile>_>
                                 .super__Head_base<0UL,_phyr::FilmTile_*,_false>._M_head_impl,
                                 &local_70);
    pPVar3 = getPixel(local_78,&local_70);
    SampledSpectrum::toXYZConstants(&this_00->contributionSum,&local_68);
    dVar2 = pPVar3->xyz[1];
    pPVar3->xyz[0] = pPVar3->xyz[0] + local_68;
    pPVar3->xyz[1] = dVar2 + dStack_60;
    pPVar3->xyz[2] = local_58 + pPVar3->xyz[2];
    pPVar3->filterWeightSum = this_00->filterWeightSum + pPVar3->filterWeightSum;
    Bounds2iIterator::operator++(&local_98);
  }
  pthread_mutex_unlock(local_88);
  return;
}

Assistant:

void Film::mergeFilmTile(std::unique_ptr<FilmTile> tile) {
    // Acquire lock
    std::lock_guard<std::mutex> lock(mutex);

    // Iterate through all pixels within pixel bounds
    for (Point2i pixel : tile->getPixelBounds()) {
        // Merge pixel into {Film::pixels}
        FilmTilePixel& tilePixel = tile->getPixel(pixel);
        Pixel& filmPixel = getPixel(pixel);

        // Get xyz spectrum data
        Real xyz[3];
        tilePixel.contributionSum.toXYZConstants(xyz);
        // Add spectrum data to {filmPixel}
        filmPixel.xyz[0] += xyz[0]; filmPixel.xyz[1] += xyz[1];
        filmPixel.xyz[2] += xyz[2];
        filmPixel.filterWeightSum += tilePixel.filterWeightSum;
    }
}